

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O2

TagSet * __thiscall
Omega_h::get_all_mesh_tags_abi_cxx11_(TagSet *__return_storage_ptr__,Omega_h *this,Mesh *mesh)

{
  Int IVar1;
  TagBase *this_00;
  string *__v;
  Int j;
  int i_00;
  Int i;
  long lVar2;
  
  std::
  array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
  ::array(__return_storage_ptr__);
  lVar2 = 0;
  while( true ) {
    IVar1 = Mesh::dim((Mesh *)this);
    if (IVar1 < lVar2) break;
    i_00 = 0;
    while( true ) {
      IVar1 = Mesh::ntags((Mesh *)this,(Int)lVar2);
      if (IVar1 <= i_00) break;
      this_00 = Mesh::get_tag((Mesh *)this,(Int)lVar2,i_00);
      __v = TagBase::name_abi_cxx11_(this_00);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)(__return_storage_ptr__->_M_elems + lVar2),__v);
      i_00 = i_00 + 1;
    }
    lVar2 = lVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

TagSet get_all_mesh_tags(Mesh* mesh) {
  TagSet out;
  for (Int i = 0; i <= mesh->dim(); ++i) {
    for (Int j = 0; j < mesh->ntags(i); ++j) {
      auto tagbase = mesh->get_tag(i, j);
      out[size_t(i)].insert(tagbase->name());
    }
  }
  return out;
}